

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fourier_transform.cc
# Opt level: O2

void __thiscall sptk::FourierTransform::FourierTransform(FourierTransform *this,int length)

{
  bool bVar1;
  FourierTransformInterface *pFVar2;
  
  this->_vptr_FourierTransform = (_func_int **)&PTR__FourierTransform_00111bb0;
  bVar1 = IsPowerOfTwo(length);
  if (bVar1) {
    pFVar2 = (FourierTransformInterface *)operator_new(0x38);
    pFVar2->_vptr_FourierTransformInterface =
         (_func_int **)&PTR__FastFourierTransformWrapper_00111be0;
    FastFourierTransform::FastFourierTransform((FastFourierTransform *)(pFVar2 + 1),length);
  }
  else {
    pFVar2 = (FourierTransformInterface *)operator_new(0x48);
    pFVar2->_vptr_FourierTransformInterface =
         (_func_int **)&PTR__DiscreteFourierTransformWrapper_00111c38;
    DiscreteFourierTransform::DiscreteFourierTransform
              ((DiscreteFourierTransform *)(pFVar2 + 1),length);
  }
  this->fourier_transform_ = pFVar2;
  return;
}

Assistant:

FourierTransform::FourierTransform(int length) {
  if (sptk::IsPowerOfTwo(length)) {
    fourier_transform_ = new FastFourierTransformWrapper(length);
  } else {
    fourier_transform_ = new DiscreteFourierTransformWrapper(length);
  }
}